

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_lessthan(lua_State *L,int idx1,int idx2)

{
  TValue *base_00;
  TValue *pTVar1;
  TValue *pTVar2;
  int in_EDX;
  int in_ESI;
  lua_State *in_RDI;
  TValue *base;
  cTValue *o2;
  cTValue *o1;
  uint local_14;
  
  base_00 = index2adr(in_RDI,in_ESI);
  pTVar1 = index2adr(in_RDI,in_EDX);
  if ((base_00 == (TValue *)((ulong)(in_RDI->glref).ptr32 + 0x130)) ||
     (pTVar1 == (TValue *)((ulong)(in_RDI->glref).ptr32 + 0x130))) {
    local_14 = 0;
  }
  else if (((base_00->field_2).it < 0xffff0000) && ((pTVar1->field_2).it < 0xffff0000)) {
    local_14 = (uint)(base_00->n < pTVar1->n);
  }
  else {
    pTVar2 = lj_meta_comp(L,(cTValue *)CONCAT44(idx1,idx2),o1,o2._4_4_);
    if (pTVar2 < (TValue *)0x2) {
      local_14 = (uint)pTVar2;
    }
    else {
      in_RDI->top = pTVar2 + 2;
      jit_secure_call((lua_State *)CONCAT44(in_ESI,in_EDX),base_00,(int)((ulong)pTVar1 >> 0x20));
      in_RDI->top = in_RDI->top + -2;
      local_14 = (uint)(*(uint *)((long)in_RDI->top + 0xc) < 0xfffffffe);
    }
  }
  return local_14;
}

Assistant:

LUA_API int lua_lessthan(lua_State *L, int idx1, int idx2)
{
  cTValue *o1 = index2adr(L, idx1);
  cTValue *o2 = index2adr(L, idx2);
  if (o1 == niltv(L) || o2 == niltv(L)) {
    return 0;
  } else if (tvisint(o1) && tvisint(o2)) {
    return intV(o1) < intV(o2);
  } else if (tvisnumber(o1) && tvisnumber(o2)) {
    return numberVnum(o1) < numberVnum(o2);
  } else {
    TValue *base = lj_meta_comp(L, o1, o2, 0);
    if ((uintptr_t)base <= 1) {
      return (int)(uintptr_t)base;
    } else {
      L->top = base+2;
      jit_secure_call(L, base, 1+1);
      L->top -= 2+LJ_FR2;
      return tvistruecond(L->top+1+LJ_FR2);
    }
  }
}